

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O2

int __thiscall draco::RAnsDecoder<13>::rans_read(RAnsDecoder<13> *this)

{
  pointer prVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = (this->ans_).state;
  uVar2 = (this->ans_).buf_offset;
  while ((uVar3 < 0x8000 && (0 < (int)uVar2))) {
    uVar2 = uVar2 - 1;
    (this->ans_).buf_offset = uVar2;
    uVar3 = uVar3 << 8 | (uint)(this->ans_).buf[uVar2];
    (this->ans_).state = uVar3;
  }
  prVar1 = (this->probability_table_).
           super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (this->lut_table_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start[uVar3 & 0x1fff];
  (this->ans_).state =
       ((uVar3 >> 0xd) * prVar1[uVar2].prob + (uVar3 & 0x1fff)) - prVar1[uVar2].cum_prob;
  return uVar2;
}

Assistant:

inline int rans_read() {
    unsigned rem;
    unsigned quo;
    struct rans_dec_sym sym;
    while (ans_.state < l_rans_base && ans_.buf_offset > 0) {
      ans_.state = ans_.state * DRACO_ANS_IO_BASE + ans_.buf[--ans_.buf_offset];
    }
    // |rans_precision| is a power of two compile time constant, and the below
    // division and modulo are going to be optimized by the compiler.
    quo = ans_.state / rans_precision;
    rem = ans_.state % rans_precision;
    fetch_sym(&sym, rem);
    ans_.state = quo * sym.prob + rem - sym.cum_prob;
    return sym.val;
  }